

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx86_64-ABI-code.c
# Opt level: O1

int classify_arg(c2m_ctx_t c2m_ctx,type *type,MIR_type_t *types,int bit_field_p)

{
  void *pvVar1;
  long lVar2;
  type *type_00;
  MIR_type_t *pMVar3;
  int iVar4;
  uint uVar5;
  MIR_type_t MVar6;
  MIR_type_t MVar7;
  mir_size_t mVar8;
  ulong uVar9;
  node_t pnVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  MIR_type_t subtypes [2];
  MIR_type_t local_50 [2];
  ulong local_48;
  MIR_type_t *local_40;
  ulong local_38;
  
  mVar8 = raw_type_size(c2m_ctx,type);
  uVar11 = (ulong)type->align;
  if (uVar11 != 0) {
    uVar14 = (mVar8 - 1) + uVar11;
    mVar8 = uVar14 - uVar14 % uVar11;
  }
  if (type->mode - TM_STRUCT < 3) {
    uVar11 = mVar8 + 7;
    iVar4 = 0;
    if (uVar11 < 0x18) {
      uVar14 = uVar11 >> 3;
      if (7 < uVar11) {
        uVar9 = 0;
        do {
          types[uVar9] = 0x14;
          uVar9 = uVar9 + 1;
        } while (uVar14 != uVar9);
      }
      uVar5 = type->mode - TM_STRUCT;
      if (uVar5 < 2) {
        pnVar10 = (((type->u).tag_type)->u).ops.head;
        if (pnVar10 != (node_t)0x0) {
          pnVar10 = (pnVar10->op_link).next;
        }
        pnVar10 = (pnVar10->u).ops.head;
        local_48 = uVar11;
        if (pnVar10 != (node_t)0x0) {
          local_40 = types + 1;
          do {
            if (pnVar10->code == N_MEMBER) {
              pvVar1 = pnVar10->attr;
              uVar11 = *(ulong *)((long)pvVar1 + 0x10);
              if (*(long *)((long)pvVar1 + 0x48) != 0) {
                lVar2 = *(long *)(*(long *)((long)pvVar1 + 0x48) + 8);
                if ((*(uint *)(*(long *)(lVar2 + 0x40) + 0x18) & 0xfffffffe) != 4) {
                  __assert_fail("decl2->decl_spec.type->mode == TM_STRUCT || decl2->decl_spec.type->mode == TM_UNION"
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/x86_64/cx86_64-ABI-code.c"
                                ,0x45,
                                "int classify_arg(c2m_ctx_t, struct type *, MIR_type_t *, int)");
                }
                uVar11 = uVar11 - *(long *)(lVar2 + 0x10);
              }
              type_00 = *(type **)((long)pvVar1 + 0x40);
              mVar8 = raw_type_size(c2m_ctx,type_00);
              uVar9 = (ulong)type_00->align;
              if (uVar9 != 0) {
                uVar13 = (mVar8 - 1) + uVar9;
                mVar8 = uVar13 - uVar13 % uVar9;
              }
              iVar4 = (int)(uVar11 >> 3);
              if (*(int *)((long)pvVar1 + 4) < 0) {
                uVar5 = classify_arg(c2m_ctx,*(type **)((long)pvVar1 + 0x40),local_50,(int)mVar8);
                pMVar3 = local_40;
                if (uVar5 == 0) {
                  return 0;
                }
                if (0 < (int)uVar5) {
                  uVar9 = (ulong)iVar4;
                  uVar13 = uVar14 - uVar9;
                  if (uVar14 < uVar9) {
                    uVar13 = 0;
                  }
                  local_38 = (ulong)uVar5;
                  uVar12 = 0;
                  do {
                    if (uVar13 == uVar12) break;
                    MVar7 = local_50[uVar12];
                    MVar6 = get_result_type(MVar7,pMVar3[uVar9 + (uVar12 - 1)]);
                    pMVar3[uVar9 + (uVar12 - 1)] = MVar6;
                    if ((int)uVar5 <= (int)((uVar11 - 1) + mVar8 >> 3) - iVar4) {
                      MVar7 = get_result_type(MVar7,pMVar3[uVar9 + uVar12]);
                      pMVar3[uVar9 + uVar12] = MVar7;
                    }
                    uVar12 = uVar12 + 1;
                  } while (local_38 != uVar12);
                }
              }
              else {
                MVar7 = types[iVar4];
                if (MVar7 != MIR_T_UNDEF) {
                  MVar7 = MIR_T_I64;
                }
                types[iVar4] = MVar7;
              }
            }
            pnVar10 = (pnVar10->op_link).next;
          } while (pnVar10 != (node_t)0x0);
        }
      }
      else {
        if (type->mode != TM_ARR) {
          __assert_fail("FALSE",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/x86_64/cx86_64-ABI-code.c"
                        ,0x5b,"int classify_arg(c2m_ctx_t, struct type *, MIR_type_t *, int)");
        }
        iVar4 = classify_arg(c2m_ctx,((type->u).ptr_type)->arr_type,local_50,uVar5);
        if (iVar4 == 0) {
          return 0;
        }
        local_48 = uVar11;
        if (7 < uVar11) {
          uVar11 = 0;
          do {
            MVar7 = get_result_type(types[uVar11],
                                    local_50[(long)((ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 |
                                                   uVar11 & 0xffffffff) % (long)iVar4 & 0xffffffff])
            ;
            types[uVar11] = MVar7;
            uVar11 = uVar11 + 1;
          } while (uVar14 != uVar11);
        }
      }
      if (7 < local_48) {
        uVar11 = 0;
        do {
          if (types[uVar11] == 0x15) {
            if (uVar11 == 0) {
              return 0;
            }
            if (types[uVar11 - 1] != MIR_T_LD) {
              return 0;
            }
          }
          else if (types[uVar11] == MIR_T_UNDEF) {
            return 0;
          }
          uVar11 = uVar11 + 1;
        } while (uVar14 != uVar11);
      }
      iVar4 = (int)uVar14;
    }
  }
  else {
    iVar4 = scalar_type_p(type);
    if (iVar4 == 0) {
      __assert_fail("scalar_type_p (type)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/x86_64/cx86_64-ABI-code.c"
                    ,0x6c,"int classify_arg(c2m_ctx_t, struct type *, MIR_type_t *, int)");
    }
    MVar7 = get_mir_type(c2m_ctx,type);
    if (MVar7 - MIR_T_F < 2) {
      *types = MIR_T_D;
    }
    else {
      if (MVar7 == MIR_T_LD) {
        types[0] = MIR_T_LD;
        types[1] = 0x15;
        return 2;
      }
      *types = MIR_T_I64;
    }
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

static int classify_arg (c2m_ctx_t c2m_ctx, struct type *type, MIR_type_t types[MAX_QWORDS],
                         int bit_field_p MIR_UNUSED) {
  size_t size = type_size (c2m_ctx, type), n_qwords = (size + 7) / 8;
  MIR_type_t mir_type;

  if (type->mode == TM_STRUCT || type->mode == TM_UNION || type->mode == TM_ARR) {
    if (n_qwords > MAX_QWORDS) return 0; /* too big aggregate */

#ifndef _WIN32
    MIR_type_t subtypes[MAX_QWORDS];
    int i, n_el_qwords;
    for (i = 0; (size_t) i < n_qwords; i++) types[i] = (MIR_type_t) NO_CLASS;

    switch (type->mode) {
    case TM_ARR: { /* Arrays are handled as small records.  */
      n_el_qwords = classify_arg (c2m_ctx, type->u.arr_type->el_type, subtypes, FALSE);
      if (n_el_qwords == 0) return 0;
      /* make full types: */
      for (i = 0; (size_t) i < n_qwords; i++)
        types[i] = get_result_type (types[i], subtypes[i % n_el_qwords]);
      break;
    }
    case TM_STRUCT:
    case TM_UNION:
      for (node_t el = NL_HEAD (NL_EL (type->u.tag_type->u.ops, 1)->u.ops); el != NULL;
           el = NL_NEXT (el))
        if (el->code == N_MEMBER) {
          decl_t decl = el->attr;
          mir_size_t offset = decl->offset;
          node_t container;
          if ((container = decl->containing_unnamed_anon_struct_union_member) != NULL) {
            decl_t decl2 = container->attr;
            assert (decl2->decl_spec.type->mode == TM_STRUCT
                    || decl2->decl_spec.type->mode == TM_UNION);
            offset -= decl2->offset;
          }
          int start_qword = offset / 8;
          int end_qword = (offset + type_size (c2m_ctx, decl->decl_spec.type) - 1) / 8;
          int span_qwords = end_qword - start_qword + 1;

          if (decl->bit_offset >= 0) {
            types[start_qword] = get_result_type (MIR_T_I64, types[start_qword]);
          } else {
            n_el_qwords
              = classify_arg (c2m_ctx, decl->decl_spec.type, subtypes, decl->bit_offset >= 0);
            if (n_el_qwords == 0) return 0;
            for (i = 0; i < n_el_qwords && (size_t) (i + start_qword) < n_qwords; i++) {
              types[i + start_qword] = get_result_type (subtypes[i], types[i + start_qword]);
              if (span_qwords > n_el_qwords)
                types[i + start_qword + 1]
                  = get_result_type (subtypes[i], types[i + start_qword + 1]);
            }
          }
        }
      break;
    default: assert (FALSE);
    }

    if (n_qwords > 2) return 0; /* as we don't have vector values (see SSEUP_CLASS) */

    for (i = 0; (size_t) i < n_qwords; i++) {
      if (types[i] == MIR_T_UNDEF) return 0; /* pass in memory if a word class is memory.  */
      if ((enum add_arg_class) types[i] == X87UP_CLASS && (i == 0 || types[i - 1] != MIR_T_LD))
        return 0;
    }
    return n_qwords;
#else
    types[0] = MIR_T_I64;
    return 1;
#endif
  }

  assert (scalar_type_p (type));
  switch (mir_type = get_mir_type (c2m_ctx, type)) {
  case MIR_T_F:
  case MIR_T_D: types[0] = MIR_T_D; return 1;
  case MIR_T_LD:
    types[0] = MIR_T_LD;
    types[1] = (MIR_type_t) X87UP_CLASS;
    return 2;
  default: types[0] = MIR_T_I64; return 1;
  }
}